

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_array.c
# Opt level: O2

void parse_array_should_not_parse_non_arrays(void)

{
  assert_not_array("");
  assert_not_array("[");
  assert_not_array("]");
  assert_not_array("{\"hello\":[]}");
  assert_not_array("42");
  assert_not_array("3.14");
  assert_not_array("\"[]hello world!\n\"");
  return;
}

Assistant:

static void parse_array_should_not_parse_non_arrays(void)
{
    assert_not_array("");
    assert_not_array("[");
    assert_not_array("]");
    assert_not_array("{\"hello\":[]}");
    assert_not_array("42");
    assert_not_array("3.14");
    assert_not_array("\"[]hello world!\n\"");
}